

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void wr_misc(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  wr_string(world->name);
  if (0 < world->num_levels) {
    lVar1 = 8;
    lVar2 = 0;
    do {
      wr_byte(*(uint8_t *)((long)&world->levels->index + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x50;
    } while (lVar2 < world->num_levels);
  }
  wr_u32b(seed_randart);
  wr_u32b(seed_flavor);
  wr_u16b(player->total_winner);
  wr_u16b(player->noscore);
  wr_byte(player->is_dead);
  wr_s32b(turn);
  lVar1 = -6;
  do {
    wr_byte(*(uint8_t *)((long)player->obj_k->modifiers + lVar1));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  lVar1 = 0;
  do {
    wr_s16b(player->obj_k->modifiers[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x11);
  lVar1 = 0;
  do {
    wr_s16b(player->obj_k->el_info[lVar1].res_level);
    wr_byte(player->obj_k->el_info[lVar1].flags);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1c);
  if (z_info->brand_max != '\0') {
    uVar3 = 0;
    do {
      wr_byte(player->obj_k->brands[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < z_info->brand_max);
  }
  if (z_info->slay_max != '\0') {
    uVar3 = 0;
    do {
      wr_byte(player->obj_k->slays[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < z_info->slay_max);
  }
  if (z_info->curse_max != '\0') {
    uVar3 = 0;
    do {
      wr_byte(player->obj_k->curses[uVar3].power != L'\0');
      uVar3 = uVar3 + 1;
    } while (uVar3 < z_info->curse_max);
  }
  wr_s16b(player->obj_k->ac);
  wr_s16b(player->obj_k->to_a);
  wr_s16b(player->obj_k->to_h);
  wr_s16b(player->obj_k->to_d);
  wr_byte(player->obj_k->dd);
  wr_byte(player->obj_k->ds);
  return;
}

Assistant:

void wr_misc(void)
{
	size_t i;
	int j;

	/* Map */
	wr_string(world->name);

	/* Where we've been */
	for (j = 0; j < world->num_levels; j++) {
		wr_byte(world->levels[j].visited ? 1 : 0);
	}

	/* Random artifact seed */
	wr_u32b(seed_randart);

	/* Write the "object seeds" */
	wr_u32b(seed_flavor);

	/* Special stuff */
	wr_u16b(player->total_winner);
	wr_u16b(player->noscore);

	/* Write death */
	wr_byte(player->is_dead);

	/* Current turn */
	wr_s32b(turn);

	/* Property knowledge */
	/* Flags */
	for (i = 0; i < OF_SIZE; i++)
		wr_byte(player->obj_k->flags[i]);

	/* Modifiers */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		wr_s16b(player->obj_k->modifiers[i]);
	}

	/* Elements */
	for (i = 0; i < ELEM_MAX; i++) {
		wr_s16b(player->obj_k->el_info[i].res_level);
		wr_byte(player->obj_k->el_info[i].flags);
	}

	/* Brands */
	for (i = 0; i < z_info->brand_max; i++) {
		wr_byte(player->obj_k->brands[i] ? 1 : 0);
	}

	/* Slays */
	for (i = 0; i < z_info->slay_max; i++) {
		wr_byte(player->obj_k->slays[i] ? 1 : 0);
	}

	/* Curses */
	for (i = 0; i < z_info->curse_max; i++) {
		wr_byte(player->obj_k->curses[i].power ? 1 : 0);
	}

	/* Combat data */
	wr_s16b(player->obj_k->ac);
	wr_s16b(player->obj_k->to_a);
	wr_s16b(player->obj_k->to_h);
	wr_s16b(player->obj_k->to_d);
	wr_byte(player->obj_k->dd);
	wr_byte(player->obj_k->ds);
}